

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

uint64 Js::JavascriptExceptionOperators::GetStackTraceLimit
                 (Var thrownObject,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  ScriptConfiguration *this;
  RecyclableObject *errorObject;
  JavascriptLibrary *this_00;
  ThreadContext *pTVar5;
  undefined4 *puVar6;
  double value_00;
  ulong local_70;
  ulong local_68;
  double value;
  Var var;
  JavascriptFunction *pJStack_48;
  DisableImplicitFlags disableImplicitFlags;
  JavascriptFunction *error;
  ulong uStack_38;
  HRESULT hr;
  uint64 limit;
  ScriptContext *scriptContext_local;
  Var thrownObject_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  uStack_38 = 0;
  limit = (uint64)scriptContext;
  scriptContext_local = (ScriptContext *)thrownObject;
  this = ScriptContext::GetConfig(scriptContext);
  bVar2 = ScriptConfiguration::IsErrorStackTraceEnabled(this);
  if ((bVar2) && (bVar2 = IsErrorInstance(scriptContext_local), bVar2)) {
    errorObject = VarTo<Js::RecyclableObject>(scriptContext_local);
    error._4_4_ = JavascriptError::GetRuntimeError(errorObject,(LPCWSTR *)0x0);
    this_00 = ScriptContext::GetLibrary((ScriptContext *)limit);
    pJStack_48 = JavascriptLibraryBase::GetErrorConstructor(&this_00->super_JavascriptLibraryBase);
    pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)limit);
    var._7_1_ = ThreadContext::GetDisableImplicitFlags(pTVar5);
    if (error._4_4_ == -0x7ff5ffe4) {
      pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)limit);
      ThreadContext::SetDisableImplicitFlags(pTVar5,DisableImplicitCallAndExceptionFlag);
    }
    value = 0.0;
    BVar3 = Js::JavascriptOperators::GetPropertyNoCache
                      ((RecyclableObject *)pJStack_48,0x162,(Var *)&value,(ScriptContext *)limit);
    if (BVar3 != 0) {
      thrownObject_local = (Var)value;
      if (value == 0.0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = TaggedInt::Is(thrownObject_local);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(thrownObject_local);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(thrownObject_local);
          if (pRStack_10 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                               ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_14 = RecyclableObject::GetTypeId(pRStack_10);
          if ((0x57 < (int)local_14) &&
             (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                               ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                               "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_18 = local_14;
        }
      }
      if (local_18 - TypeIds_FirstNumberType < 4) {
        value_00 = JavascriptConversion::ToNumber((Var)value,(ScriptContext *)limit);
        BVar3 = JavascriptNumber::IsNan(value_00);
        if (BVar3 == 0) {
          bVar2 = NumberUtilities::IsFinite(value_00);
          if (bVar2) {
            uVar4 = JavascriptConversion::ToUInt32((Var)value,(ScriptContext *)limit);
            local_70 = (ulong)uVar4;
          }
          else {
            local_70 = 0xffffffffffffffff;
          }
          local_68 = local_70;
        }
        else {
          local_68 = 0;
        }
        uStack_38 = local_68;
      }
    }
    if (error._4_4_ == -0x7ff5ffe4) {
      pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)limit);
      ThreadContext::SetDisableImplicitFlags(pTVar5,var._7_1_);
    }
  }
  return uStack_38;
}

Assistant:

uint64 JavascriptExceptionOperators::GetStackTraceLimit(Var thrownObject, ScriptContext* scriptContext)
    {
        uint64 limit = 0;

        if (scriptContext->GetConfig()->IsErrorStackTraceEnabled()
            && IsErrorInstance(thrownObject))
        {
            HRESULT hr = JavascriptError::GetRuntimeError(VarTo<RecyclableObject>(thrownObject), NULL);
            JavascriptFunction* error = scriptContext->GetLibrary()->GetErrorConstructor();

            // If we are throwing StackOverflow and Error.stackTraceLimit is a custom getter, we can't make the getter
            // call as we don't have stack space. Just bail out without stack trace in such case. Only proceed to get
            // Error.stackTraceLimit property if we are not throwing StackOverflow, or there is no implicitCall (in getter case).
            DisableImplicitFlags disableImplicitFlags = scriptContext->GetThreadContext()->GetDisableImplicitFlags();
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(DisableImplicitCallAndExceptionFlag);
            }

            Var var = nullptr;
            if (JavascriptOperators::GetPropertyNoCache(error, PropertyIds::stackTraceLimit, &var, scriptContext))
            {
                // Only accept the value if it is a "Number". Avoid potential valueOf() call.
                switch (JavascriptOperators::GetTypeId(var))
                {
                case TypeIds_Integer:
                case TypeIds_Number:
                case TypeIds_Int64Number:
                case TypeIds_UInt64Number:
                    double value = JavascriptConversion::ToNumber(var, scriptContext);
                    limit = JavascriptNumber::IsNan(value) ? 0 :
                        (NumberUtilities::IsFinite(value) ? JavascriptConversion::ToUInt32(var, scriptContext) : MaxStackTraceLimit);
                    break;
                }
            }
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(disableImplicitFlags);
            }
    }

        return limit;
    }